

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::TranslateToFuzzReader
          (TranslateToFuzzReader *this,Module *wasm,vector<char,_std::allocator<char>_> *input,
          bool closedWorld)

{
  unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  __p;
  Random *this_00;
  bool bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  __uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  local_b8;
  bool bStack_b0;
  undefined7 uStack_af;
  Builder local_a8;
  pointer pcStack_a0;
  Random *local_50;
  double local_48;
  char *pcStack_40;
  
  this->wasm = wasm;
  this->closedWorld = closedWorld;
  (this->builder).wasm = wasm;
  local_50 = &this->random;
  Random::Random(local_50,input,(FeatureSet)(wasm->features).features);
  this->allowMemory = true;
  this->allowOOB = true;
  this->preserveImportsAndExports = false;
  *(undefined8 *)&this->LOGGING_PERCENT = 0;
  *(undefined8 *)((long)&(this->HANG_LIMIT_GLOBAL).super_IString.str._M_len + 4) = 0;
  *(undefined8 *)((long)&(this->HANG_LIMIT_GLOBAL).super_IString.str._M_str + 4) = 0;
  *(undefined8 *)((long)&(this->funcrefTableName).super_IString.str._M_len + 4) = 0;
  *(undefined8 *)((long)&(this->funcrefTableName).super_IString.str._M_str + 4) = 0;
  *(undefined8 *)((long)&(this->exnrefTableName).super_IString.str._M_len + 4) = 0;
  *(undefined4 *)((long)&(this->exnrefTableName).super_IString.str._M_str + 4) = 0;
  (this->logImportNames)._M_h._M_buckets = &(this->logImportNames)._M_h._M_single_bucket;
  (this->logImportNames)._M_h._M_bucket_count = 1;
  (this->logImportNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->logImportNames)._M_h._M_element_count = 0;
  (this->logImportNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->logImportNames)._M_h._M_rehash_policy._M_next_resize,0,0xa0);
  (this->globalsByType)._M_h._M_buckets = &(this->globalsByType)._M_h._M_single_bucket;
  (this->globalsByType)._M_h._M_bucket_count = 1;
  (this->globalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalsByType)._M_h._M_element_count = 0;
  (this->globalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mutableGlobalsByType)._M_h._M_buckets = &(this->mutableGlobalsByType)._M_h._M_single_bucket
  ;
  (this->mutableGlobalsByType)._M_h._M_bucket_count = 1;
  (this->mutableGlobalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mutableGlobalsByType)._M_h._M_element_count = 0;
  (this->mutableGlobalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mutableGlobalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mutableGlobalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->immutableGlobalsByType)._M_h._M_buckets =
       &(this->immutableGlobalsByType)._M_h._M_single_bucket;
  (this->immutableGlobalsByType)._M_h._M_bucket_count = 1;
  (this->immutableGlobalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->immutableGlobalsByType)._M_h._M_element_count = 0;
  (this->immutableGlobalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->immutableGlobalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->immutableGlobalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->importedImmutableGlobalsByType)._M_h._M_buckets =
       &(this->importedImmutableGlobalsByType)._M_h._M_single_bucket;
  (this->importedImmutableGlobalsByType)._M_h._M_bucket_count = 1;
  (this->importedImmutableGlobalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->importedImmutableGlobalsByType)._M_h._M_element_count = 0;
  (this->importedImmutableGlobalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importedImmutableGlobalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->importedImmutableGlobalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interestingHeapSubTypes)._M_h._M_buckets =
       &(this->interestingHeapSubTypes)._M_h._M_single_bucket;
  (this->interestingHeapSubTypes)._M_h._M_bucket_count = 1;
  (this->interestingHeapSubTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interestingHeapSubTypes)._M_h._M_element_count = 0;
  (this->interestingHeapSubTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interestingHeapSubTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interestingHeapSubTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->typeStructFields)._M_h._M_buckets = &(this->typeStructFields)._M_h._M_single_bucket;
  (this->typeStructFields)._M_h._M_bucket_count = 1;
  (this->typeStructFields)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeStructFields)._M_h._M_element_count = 0;
  (this->typeStructFields)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeStructFields)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeStructFields)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->typeArrays)._M_h._M_buckets = &(this->typeArrays)._M_h._M_single_bucket;
  (this->typeArrays)._M_h._M_bucket_count = 1;
  (this->typeArrays)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeArrays)._M_h._M_element_count = 0;
  (this->typeArrays)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutableStructFields).
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mutableStructFields).
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mutableStructFields).
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typeArrays)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeArrays)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->numAddedFunctions = 0;
  (this->globalParams)._M_t.
  super___uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
       (FuzzParamsContext *)0x0;
  this->nesting = 0;
  this->trivialNesting = 0;
  this->funcContext = (FunctionCreationContext *)0x0;
  this->fuzzParams = (FuzzParamsContext *)0x0;
  (this->trivialTag).super_IString.str._M_len = 0;
  (this->trivialTag).super_IString.str._M_str = (char *)0x0;
  local_a8.wasm = (Module *)0x4;
  pcStack_a0 = (pointer)0x5;
  local_b8._M_t.
  super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
       (tuple<wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
        )(_Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
          )0x2;
  bStack_b0 = true;
  uStack_af = 0;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_assign_aux<wasm::Type_const*>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)&this->loggableTypes,
             &stack0xffffffffffffff48);
  if (((wasm->features).features & 8) != 0) {
    local_b8._M_t.
    super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
    .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
         (tuple<wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
          )(_Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
            )0x6;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
              (&this->loggableTypes,(Type *)&stack0xffffffffffffff48);
  }
  std::make_unique<wasm::TranslateToFuzzReader::FuzzParamsContext,wasm::TranslateToFuzzReader&>
            ((TranslateToFuzzReader *)&stack0xffffffffffffff48);
  __p._M_t.
  super___uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>,_true,_true>
        )(__uniq_ptr_data<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>,_true,_true>
          )local_b8._M_t.
           super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
           .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>.
           _M_head_impl;
  local_b8._M_t.
  super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
       (tuple<wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
        )(_Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
          )0x0;
  std::
  __uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ::reset((__uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
           *)&this->globalParams,
          (pointer)__p._M_t.
                   super___uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
                   .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>.
                   _M_head_impl);
  std::
  unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ::~unique_ptr((unique_ptr<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
                 *)&stack0xffffffffffffff48);
  this_00 = local_50;
  bVar1 = Random::oneIn(local_50,2);
  if (bVar1) {
    local_48 = 0.0;
    pcStack_40 = (char *)0x0;
    if ((this->random).finishedInput == false) {
      lVar3 = (long)(this->random).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)((this->random).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + (this->random).pos);
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      pcStack_40 = (char *)(auVar6._8_8_ - 1.9342813113834067e+25);
      local_48 = (double)pcStack_40 + ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)
      ;
    }
    bVar2 = Random::get(this_00);
    local_48 = local_48 / 40960.0;
    if ((bVar2 & 1) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES * local_48);
    }
    if ((bVar2 & 2) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_GLOBALS =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_GLOBALS * local_48);
    }
    if ((bVar2 & 4) != 0) {
      iVar5 = (this->fuzzParams->super_FuzzParams).HANG_LIMIT;
      if (iVar5 != 0) {
        iVar4 = (int)((double)iVar5 * local_48);
        iVar5 = 1;
        if (1 < iVar4) {
          iVar5 = iVar4;
        }
        (this->fuzzParams->super_FuzzParams).HANG_LIMIT = iVar5;
      }
    }
    if (1.0 < local_48 && (bVar2 & 8) != 0) {
      (this->fuzzParams->super_FuzzParams).TRIES =
           (int)((double)(this->fuzzParams->super_FuzzParams).TRIES * local_48);
    }
    if ((bVar2 & 0x10) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE =
           (int)(local_48 * (double)(this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE);
    }
  }
  bVar1 = Random::oneIn(this_00,2);
  this->allowAddingUnreachableCode = bVar1;
  return;
}

Assistant:

TranslateToFuzzReader::TranslateToFuzzReader(Module& wasm,
                                             std::vector<char>&& input,
                                             bool closedWorld)
  : wasm(wasm), closedWorld(closedWorld), builder(wasm),
    random(std::move(input), wasm.features) {

  // - funcref cannot be logged because referenced functions can be inlined or
  // removed during optimization
  // - there's no point in logging anyref because it is opaque
  // - don't bother logging tuples
  loggableTypes = {Type::i32, Type::i64, Type::f32, Type::f64};
  if (wasm.features.hasSIMD()) {
    loggableTypes.push_back(Type::v128);
  }

  // Setup params. Start with the defaults.
  globalParams = std::make_unique<FuzzParamsContext>(*this);

  // Some of the time, adjust parameters based on the size, e.g. allowing more
  // heap types in larger inputs, etc.
  if (random.oneIn(2)) {
    // A typical random wasm input from fuzz_opt.py is fairly large (to minimize
    // the process creation overhead of all the things we run from python), and
    // the defaults are tuned to that. This corresponds to INPUT_SIZE_MEAN in
    // scripts/fuzz_opt.py
    const double MEAN_SIZE = 40 * 1024;

    // As we have not read anything from the input, the remaining size is its
    // size.
    double size = random.remaining();
    auto ratio = size / MEAN_SIZE;

    auto bits = random.get();
    if (bits & 1) {
      fuzzParams->MAX_NEW_GC_TYPES *= ratio;
    }
    if (bits & 2) {
      fuzzParams->MAX_GLOBALS *= ratio;
    }
    if (bits & 4) {
      // Only adjust the limit if there is one.
      if (fuzzParams->HANG_LIMIT) {
        fuzzParams->HANG_LIMIT *= ratio;
        // There is a limit, so keep it non-zero to actually prevent hangs.
        fuzzParams->HANG_LIMIT = std::max(fuzzParams->HANG_LIMIT, 1);
      }
    }
    if (bits & 8) {
      // Only increase the number of tries. Trying fewer times does not help
      // find more interesting patterns.
      if (ratio > 1) {
        fuzzParams->TRIES *= ratio;
      }
    }
    if (bits & 16) {
      fuzzParams->MAX_ARRAY_SIZE *= ratio;
    }
  }

  // Half the time add no unreachable code so that we'll execute the most code
  // as possible with no early exits.
  allowAddingUnreachableCode = oneIn(2);
}